

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buttons.cpp
# Opt level: O3

void __thiscall GPIO::RotaryDial::decode_dial(RotaryDial *this)

{
  bool bVar1;
  int iVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  __int_type_conflict1 _Var5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  
  bVar1 = (this->m_pin_b).m_state;
  uVar4 = (uint)(byte)(bVar1 * '\x02' | (this->m_pin_a).m_state ^ bVar1);
  uVar10 = uVar4 - this->m_lastseq & 3;
  this->m_lastseq = uVar4;
  lVar6 = std::chrono::_V2::steady_clock::now();
  iVar2 = this->m_divider;
  if (((1 < (long)iVar2) && (this->m_encvalue != 0)) &&
     (500000000 < lVar6 - (this->m_last_triggered).__d.__r)) {
    this->m_encvalue = 0;
  }
  (this->m_last_triggered).__d.__r = lVar6;
  uVar7 = (ulong)uVar10;
  switch(uVar10) {
  default:
    return;
  case 1:
    break;
  case 3:
    uVar7 = 0xffffffffffffffff;
  }
  lVar8 = uVar7 + this->m_encvalue;
  this->m_encvalue = lVar8;
  lVar9 = -lVar8;
  if (0 < lVar8) {
    lVar9 = lVar8;
  }
  if (lVar9 < iVar2) {
    return;
  }
  lVar11 = lVar6 - (this->m_last_dialed).__d.__r;
  _Var5 = 1;
  if (lVar11 < 0x3b9aca01) {
    auVar3 = ZEXT816(0) << 0x40 | ZEXT816(1000000000);
    _Var5 = SUB164(auVar3 / SEXT816(lVar11),0);
    lVar9 = SUB168(auVar3 % SEXT816(lVar11),0);
  }
  LOCK();
  (this->m_speed).super___atomic_base<unsigned_int>._M_i = _Var5;
  UNLOCK();
  this->m_encvalue = 0;
  if (lVar8 < 1) {
    if ((this->m_use_range != false) &&
       ((this->m_value).super___atomic_base<long>._M_i == this->m_min)) {
      return;
    }
    LOCK();
    (this->m_value).super___atomic_base<long>._M_i =
         (this->m_value).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if ((this->f_down).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_0010b12c;
    lVar8 = 0xa0;
    lVar12 = 0x88;
  }
  else {
    if ((this->m_use_range != false) &&
       ((this->m_value).super___atomic_base<long>._M_i == this->m_max)) {
      return;
    }
    LOCK();
    (this->m_value).super___atomic_base<long>._M_i =
         (this->m_value).super___atomic_base<long>._M_i + 1;
    UNLOCK();
    if ((this->f_up).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_0010b12c;
    lVar8 = 0x80;
    lVar12 = 0x68;
  }
  (**(code **)((long)&(this->super_InputDetect).super_ObjectBase._vptr_ObjectBase + lVar8))
            ((long)&(this->super_InputDetect).super_ObjectBase._vptr_ObjectBase + lVar12,lVar11,
             lVar9);
LAB_0010b12c:
  if ((this->f_dialed).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(bool,_long)>::operator()
              (&this->f_dialed,uVar10 == 1,(this->m_value).super___atomic_base<long>._M_i);
  }
  (this->m_last_dialed).__d.__r = lVar6;
  return;
}

Assistant:

void RotaryDial::decode_dial()
{
    // Get the current state, use a ^ b | b << 1 to generate a 2 bit sequence by turning the dial.
    // For the logic behind the next two lines see:
    // http://guy.carpenter.id.au/gaugette/2013/01/14/rotary-encoder-library-for-the-raspberry-pi/
    
    unsigned int seq   = (m_pin_a.get_state() ^ m_pin_b.get_state()) | m_pin_b.get_state() << 1;
    unsigned int delta = (seq - m_lastseq) & 0b11;
    
    //    delta	meaning
    //    0	no change
    //    1	1 step clockwise
    //    2	2 steps clockwise or counter-clockwise
    //    3	1 step counter clockwise
    
    // store value for next turn
    m_lastseq = seq;
    
    auto now = std::chrono::steady_clock::now();
    if (m_divider > 1 && m_encvalue && now - m_last_triggered > std::chrono::nanoseconds(500 * 1000 * 1000)) {
        // reset m_encvalue, it has run out of sync by some bounces, and
        // needs certainly less than half a second between two events in a grey sequence
        m_encvalue = 0;
    }
    m_last_triggered = now;
    
    switch (delta) {
        case 0:
            // no turn
            return;
        case 1:
            ++m_encvalue;
            break;
        case 2:
            // we could assume a fast turn to the last direction, but we simply
            // drop this result (actually, the interrupt driven approach on the
            // Raspberry is fast enough to never run into this case)
            return;
        case 3:
            --m_encvalue;
            break;
    }

    if (std::abs(m_encvalue) >= m_divider) {

        set_speed(now - m_last_dialed);
        
        if (m_encvalue > 0) {
            m_encvalue = 0;
            if (m_use_range && m_value == m_max) return;
            ++m_value;
            // call the function pointer
            if (f_up) f_up();
        } else {
            m_encvalue = 0;
            if (m_use_range && m_value == m_min) return;
            --m_value;
            // call the function pointer
            if (f_down) f_down();
        }
        
        // call the function pointer
        if (f_dialed) f_dialed(delta == 1, m_value);

        m_last_dialed = now;
    }
    
}